

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O1

optional<CTxOut> * __thiscall
wallet::CCoinControl::GetExternalOutput
          (optional<CTxOut> *__return_storage_ptr__,CCoinControl *this,COutPoint *outpoint)

{
  const_iterator cVar1;
  long in_FS_OFFSET;
  CTxOut local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          ::find(&(this->m_selected)._M_t,outpoint);
  if (((_Rb_tree_header *)cVar1._M_node == &(this->m_selected)._M_t._M_impl.super__Rb_tree_header)
     || (*(char *)&cVar1._M_node[3]._M_left == '\0')) {
    (__return_storage_ptr__->super__Optional_base<CTxOut,_false,_false>)._M_payload.
    super__Optional_payload<CTxOut,_true,_false,_false>.super__Optional_payload_base<CTxOut>.
    _M_engaged = false;
  }
  else {
    PreselectedInput::GetTxOut(&local_40,(PreselectedInput *)&cVar1._M_node[2]._M_parent);
    (__return_storage_ptr__->super__Optional_base<CTxOut,_false,_false>)._M_payload.
    super__Optional_payload<CTxOut,_true,_false,_false>.super__Optional_payload_base<CTxOut>.
    _M_payload._M_value.nValue = local_40.nValue;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CTxOut,_false,_false>)._M_payload.
             super__Optional_payload<CTxOut,_true,_false,_false>.
             super__Optional_payload_base<CTxOut>._M_payload + 8) =
         local_40.scriptPubKey.super_CScriptBase._union._0_4_;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CTxOut,_false,_false>)._M_payload.
             super__Optional_payload<CTxOut,_true,_false,_false>.
             super__Optional_payload_base<CTxOut>._M_payload + 0xc) =
         local_40.scriptPubKey.super_CScriptBase._union._4_4_;
    *(size_type *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CTxOut,_false,_false>)._M_payload.
             super__Optional_payload<CTxOut,_true,_false,_false>.
             super__Optional_payload_base<CTxOut>._M_payload + 0x10) =
         local_40.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CTxOut,_false,_false>)._M_payload.
             super__Optional_payload<CTxOut,_true,_false,_false>.
             super__Optional_payload_base<CTxOut>._M_payload + 0x14) =
         local_40.scriptPubKey.super_CScriptBase._union._12_4_;
    *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<CTxOut,_false,_false>).
                      _M_payload.super__Optional_payload<CTxOut,_true,_false,_false>.
                      super__Optional_payload_base<CTxOut>._M_payload + 0x14) =
         CONCAT44(local_40.scriptPubKey.super_CScriptBase._union._16_4_,
                  local_40.scriptPubKey.super_CScriptBase._union._12_4_);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CTxOut,_false,_false>)._M_payload.
             super__Optional_payload<CTxOut,_true,_false,_false>.
             super__Optional_payload_base<CTxOut>._M_payload + 0x1c) =
         local_40.scriptPubKey.super_CScriptBase._union._20_8_;
    *(size_type *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CTxOut,_false,_false>)._M_payload.
             super__Optional_payload<CTxOut,_true,_false,_false>.
             super__Optional_payload_base<CTxOut>._M_payload + 0x24) =
         local_40.scriptPubKey.super_CScriptBase._size;
    local_40.scriptPubKey.super_CScriptBase._size = 0;
    (__return_storage_ptr__->super__Optional_base<CTxOut,_false,_false>)._M_payload.
    super__Optional_payload<CTxOut,_true,_false,_false>.super__Optional_payload_base<CTxOut>.
    _M_engaged = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CTxOut> CCoinControl::GetExternalOutput(const COutPoint& outpoint) const
{
    const auto it = m_selected.find(outpoint);
    if (it == m_selected.end() || !it->second.HasTxOut()) {
        return std::nullopt;
    }
    return it->second.GetTxOut();
}